

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O1

void google::protobuf::io::Tokenizer::ParseStringAppend(string *text,string *output)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  LogMessage *pLVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  pointer pcVar10;
  pointer pcVar11;
  uint32 unicode;
  LogFinisher local_91;
  ulong local_90;
  string local_88;
  LogMessage local_68;
  
  if (text->_M_string_length == 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x411);
    pLVar6 = internal::LogMessage::operator<<
                       (&local_68,
                        " Tokenizer::ParseStringAppend() passed text that could not have been tokenized as a string: "
                       );
    CEscape(&local_88,text);
    pLVar6 = internal::LogMessage::operator<<(pLVar6,&local_88);
    internal::LogFinisher::operator=(&local_91,pLVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_88._M_dataplus._M_p._4_4_,(LogLevel_conflict)local_88._M_dataplus._M_p) !=
        &local_88.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_88._M_dataplus._M_p._4_4_,
                               (LogLevel_conflict)local_88._M_dataplus._M_p));
    }
    internal::LogMessage::~LogMessage(&local_68);
    return;
  }
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(output->_M_dataplus)._M_p != &output->field_2) {
    uVar5 = (output->field_2)._M_allocated_capacity;
  }
  if (uVar5 < text->_M_string_length + output->_M_string_length) {
    std::__cxx11::string::reserve((ulong)output);
  }
  pcVar11 = (text->_M_dataplus)._M_p;
LAB_00303ec5:
  cVar2 = pcVar11[1];
  if (cVar2 == '\\') {
    bVar3 = pcVar11[2];
    if (bVar3 == 0) goto LAB_00303f49;
    pcVar10 = pcVar11 + 2;
    if ((bVar3 & 0xf8) == 0x30) {
      if ((pcVar11[3] & 0xf8U) == 0x30) {
        pcVar10 = pcVar11 + 3;
      }
      if ((pcVar10[1] & 0xf8U) == 0x30) {
        pcVar10 = pcVar10 + 1;
      }
    }
    else if (bVar3 < 0x62) {
      if (bVar3 < 0x55) {
        if (((bVar3 != 0x22) && (bVar3 != 0x27)) && (bVar3 != 0x3f)) goto switchD_00303f99_caseD_6f;
      }
      else {
        if (bVar3 == 0x55) goto switchD_00303f99_caseD_75;
        if ((bVar3 != 0x5c) && (bVar3 != 0x61)) goto switchD_00303f99_caseD_6f;
      }
    }
    else {
      switch(bVar3) {
      case 0x6e:
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x77:
switchD_00303f99_caseD_6f:
        break;
      case 0x72:
        break;
      case 0x74:
        break;
      case 0x75:
switchD_00303f99_caseD_75:
        uVar7 = (uint)(pcVar11[2] == 'U') << 3;
        if (pcVar11[2] == 'u') {
          uVar7 = 4;
        }
        bVar4 = ReadHexDigits(pcVar11 + 3,uVar7,(uint32 *)&local_88);
        uVar5 = 2;
        if (bVar4) {
          uVar8 = (ulong)uVar7;
          uVar5 = uVar8 | 3;
          if ((((((LogLevel_conflict)local_88._M_dataplus._M_p & 0xfffffc00) == 0xd800) &&
               (pcVar11[uVar8 + 3] == '\\')) && (pcVar11[uVar8 + 4] == 'u')) &&
             ((local_90 = (ulong)(LogLevel_conflict)local_88._M_dataplus._M_p,
              bVar4 = ReadHexDigits(pcVar11 + uVar8 + 5,4,&local_68.level_), bVar4 &&
              ((local_68.level_ & 0xfffffc00) == 0xdc00)))) {
            local_88._M_dataplus._M_p._0_4_ = local_68.level_ + (int)local_90 * 0x400 + 0xfca02400;
            uVar5 = uVar8 + 9;
          }
        }
        if (uVar5 == 2) {
          std::__cxx11::string::push_back((char)output);
          pcVar11 = pcVar10;
        }
        else {
          local_68.level_ = LOGLEVEL_INFO;
          if ((LogLevel_conflict)local_88._M_dataplus._M_p < 0x80) {
            local_68.level_ = (LogLevel_conflict)local_88._M_dataplus._M_p;
            lVar9 = 1;
LAB_00304210:
            local_68.level_ = ghtonl(local_68.level_);
            std::__cxx11::string::append((char *)output,(long)&local_68 + (4 - lVar9));
          }
          else {
            if ((LogLevel_conflict)local_88._M_dataplus._M_p < 0x800) {
              local_68.level_ =
                   ((LogLevel_conflict)local_88._M_dataplus._M_p & 0x3f) +
                   ((LogLevel_conflict)local_88._M_dataplus._M_p & 0x7c0) * 4 + 0xc080;
              lVar9 = 2;
              goto LAB_00304210;
            }
            if ((LogLevel_conflict)local_88._M_dataplus._M_p < 0x10000) {
              local_68.level_ =
                   ((LogLevel_conflict)local_88._M_dataplus._M_p & 0xf000) * 0x10 +
                   ((LogLevel_conflict)local_88._M_dataplus._M_p & 0x3f) +
                   ((LogLevel_conflict)local_88._M_dataplus._M_p & 0xfc0) * 4 + 0xe08080;
              lVar9 = 3;
              goto LAB_00304210;
            }
            if ((LogLevel_conflict)local_88._M_dataplus._M_p < 0x200000) {
              local_68.level_ =
                   ((LogLevel_conflict)local_88._M_dataplus._M_p & 0x3f |
                    ((LogLevel_conflict)local_88._M_dataplus._M_p & 0x3f000) << 4 |
                   ((LogLevel_conflict)local_88._M_dataplus._M_p & 0x1c0000) << 6) +
                   ((LogLevel_conflict)local_88._M_dataplus._M_p & 0xfc0) * 4 + 0xf0808080;
              lVar9 = 4;
              goto LAB_00304210;
            }
            StringAppendF(output,"\\U%08x");
          }
          pcVar11 = pcVar11 + (uVar5 - 1);
        }
        goto LAB_00303ec5;
      case 0x76:
        break;
      case 0x78:
        if (((byte)(pcVar11[3] - 0x30U) < 10) ||
           ((uVar7 = (byte)pcVar11[3] - 0x41, uVar7 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) != 0)))) {
          pcVar10 = pcVar11 + 3;
        }
        if (((byte)(pcVar10[1] - 0x30U) < 10) ||
           ((uVar7 = (byte)pcVar10[1] - 0x41, uVar7 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) != 0)))) {
          pcVar10 = pcVar10 + 1;
        }
        break;
      default:
        if ((bVar3 != 0x62) && (bVar3 != 0x66)) goto switchD_00303f99_caseD_6f;
      }
    }
  }
  else {
    if (cVar2 == '\0') {
      return;
    }
LAB_00303f49:
    pcVar10 = pcVar11 + 1;
    if ((cVar2 == *(text->_M_dataplus)._M_p) &&
       (pcVar1 = pcVar11 + 2, pcVar11 = pcVar10, *pcVar1 == '\0')) goto LAB_00303ec5;
  }
  std::__cxx11::string::push_back((char)output);
  pcVar11 = pcVar10;
  goto LAB_00303ec5;
}

Assistant:

void Tokenizer::ParseStringAppend(const std::string& text,
                                  std::string* output) {
  // Reminder: text[0] is always a quote character.  (If text is
  // empty, it's invalid, so we'll just return).
  const size_t text_size = text.size();
  if (text_size == 0) {
    GOOGLE_LOG(DFATAL) << " Tokenizer::ParseStringAppend() passed text that could not"
                   " have been tokenized as a string: "
                << CEscape(text);
    return;
  }

  // Reserve room for new string. The branch is necessary because if
  // there is already space available the reserve() call might
  // downsize the output.
  const size_t new_len = text_size + output->size();
  if (new_len > output->capacity()) {
    output->reserve(new_len);
  }

  // Loop through the string copying characters to "output" and
  // interpreting escape sequences.  Note that any invalid escape
  // sequences or other errors were already reported while tokenizing.
  // In this case we do not need to produce valid results.
  for (const char* ptr = text.c_str() + 1; *ptr != '\0'; ptr++) {
    if (*ptr == '\\' && ptr[1] != '\0') {
      // An escape sequence.
      ++ptr;

      if (OctalDigit::InClass(*ptr)) {
        // An octal escape.  May one, two, or three digits.
        int code = DigitValue(*ptr);
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'x') {
        // A hex escape.  May zero, one, or two digits.  (The zero case
        // will have been caught as an error earlier.)
        int code = 0;
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = DigitValue(*ptr);
        }
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 16 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'u' || *ptr == 'U') {
        uint32 unicode;
        const char* end = FetchUnicodePoint(ptr, &unicode);
        if (end == ptr) {
          // Failure: Just dump out what we saw, don't try to parse it.
          output->push_back(*ptr);
        } else {
          AppendUTF8(unicode, output);
          ptr = end - 1;  // Because we're about to ++ptr.
        }
      } else {
        // Some other escape code.
        output->push_back(TranslateEscape(*ptr));
      }

    } else if (*ptr == text[0] && ptr[1] == '\0') {
      // Ignore final quote matching the starting quote.
    } else {
      output->push_back(*ptr);
    }
  }
}